

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::ConvertTimeStampMacroString(char *str,time_t *tmt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  time_t tVar7;
  bool bVar8;
  char buffer [27];
  tm tmt2;
  char local_88 [4];
  char local_84 [3];
  undefined1 local_81;
  char local_80 [3];
  char local_7d [3];
  char local_7a [3];
  char local_77 [3];
  char local_74 [12];
  tm local_68;
  
  if ((tmt != (time_t *)0x0 && str != (char *)0x0) && (sVar5 = strlen(str), sVar5 < 0x1b)) {
    strcpy(local_88,str);
    local_81 = 0;
    pcVar6 = strstr(ConvertTimeStampMacroString::month_names,local_84);
    bVar8 = pcVar6 != (char *)0x0;
    if (!bVar8) {
      return bVar8;
    }
    iVar1 = atoi(local_80);
    iVar2 = atoi(local_7d);
    iVar3 = atoi(local_7a);
    iVar4 = atoi(local_77);
    local_68.tm_year = atoi(local_74);
    local_68.tm_isdst = -1;
    local_68.tm_wday = 0;
    local_68.tm_yday = 0;
    local_68.tm_year = local_68.tm_year + -0x76c;
    local_68.tm_sec = iVar4;
    local_68.tm_min = iVar3;
    local_68.tm_hour = iVar2;
    local_68.tm_mday = iVar1;
    local_68.tm_mon = (int)((long)(pcVar6 + -0x6050e0) / 3);
    tVar7 = mktime(&local_68);
    *tmt = tVar7;
    return bVar8;
  }
  return false;
}

Assistant:

bool SystemTools::ConvertTimeStampMacroString(const char *str, time_t *tmt)
{
  if (!str || !tmt || strlen(str) > 26)
    {
    return false;
    }

  struct tm tmt2;

  // __TIMESTAMP__
  // The date and time of the last modification of the current source file,
  // expressed as a string literal in the form Ddd Mmm Date hh:mm:ss yyyy,
  /// where Ddd is the abbreviated day of the week and Date is an integer
  // from 1 to 31.

  // index:   0123456789
  //                    0123456789
  //                              0123456789
  // format:  Ddd Mmm Date hh:mm:ss yyyy
  // example: Fri Dec 19 14:34:58 2003

  static char month_names[] = "JanFebMarAprMayJunJulAugSepOctNovDec";

  char buffer[27];
  strcpy(buffer, str);

  buffer[7] = 0;
  char *ptr = strstr(month_names, buffer + 4);
  if (!ptr)
    {
    return false;
    }

  int month = static_cast<int>((ptr - month_names) / 3);
  int day = atoi(buffer + 8);
  int hour = atoi(buffer + 11);
  int min = atoi(buffer + 14);
  int sec = atoi(buffer + 17);
  int year = atoi(buffer + 20);

  tmt2.tm_isdst = -1;
  tmt2.tm_hour  = hour;
  tmt2.tm_min   = min;
  tmt2.tm_sec   = sec;
  tmt2.tm_wday  = 0;
  tmt2.tm_yday  = 0;
  tmt2.tm_mday  = day;
  tmt2.tm_mon   = month;
  tmt2.tm_year  = year - 1900;

  *tmt = mktime(&tmt2);
  return true;
}